

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall QNetworkReplyImplPrivate::_q_bufferOutgoingData(QNetworkReplyImplPrivate *this)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  longlong lVar4;
  long lVar5;
  QRingBuffer *__tmp;
  long in_FS_OFFSET;
  QObject local_30 [8];
  QObject local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pcVar1 = *(char **)&(this->super_QNetworkReplyPrivate).field_0x8;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cbc88;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[2]._M_weak_count = 0;
    *(undefined4 *)&p_Var3[3]._vptr__Sp_counted_base = 0x1000;
    (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var3 + 1);
    this_00 = (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    QObject::connect(local_28,(char *)this->outgoingData,(QObject *)"2readyRead()",pcVar1,0x25c958);
    QMetaObject::Connection::~Connection((Connection *)local_28);
    QObject::connect(local_30,(char *)this->outgoingData,(QObject *)"2readChannelFinished()",pcVar1,
                     0x25c988);
    QMetaObject::Connection::~Connection((Connection *)local_30);
  }
  do {
    (**(code **)(*(long *)this->outgoingData + 0xa0))();
    lVar4 = QRingBuffer::reserve
                      ((longlong)
                       (this->outgoingDataBuffer).
                       super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    lVar5 = QIODevice::read((char *)this->outgoingData,lVar4);
    peVar2 = (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (lVar5 == 0) {
      QRingBuffer::chop((longlong)peVar2);
LAB_00198e2f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
      __stack_chk_fail();
    }
    if (lVar5 == -1) {
      QRingBuffer::chop((longlong)peVar2);
      _q_bufferOutgoingDataFinished(this);
      goto LAB_00198e2f;
    }
    QRingBuffer::chop((longlong)peVar2);
  } while( true );
}

Assistant:

void QNetworkReplyImplPrivate::_q_bufferOutgoingData()
{
    Q_Q(QNetworkReplyImpl);

    if (!outgoingDataBuffer) {
        // first call, create our buffer
        outgoingDataBuffer = std::make_shared<QRingBuffer>();

        QObject::connect(outgoingData, SIGNAL(readyRead()), q, SLOT(_q_bufferOutgoingData()));
        QObject::connect(outgoingData, SIGNAL(readChannelFinished()), q, SLOT(_q_bufferOutgoingDataFinished()));
    }

    qint64 bytesBuffered = 0;
    qint64 bytesToBuffer = 0;

    // read data into our buffer
    forever {
        bytesToBuffer = outgoingData->bytesAvailable();
        // unknown? just try 2 kB, this also ensures we always try to read the EOF
        if (bytesToBuffer <= 0)
            bytesToBuffer = 2*1024;

        char *dst = outgoingDataBuffer->reserve(bytesToBuffer);
        bytesBuffered = outgoingData->read(dst, bytesToBuffer);

        if (bytesBuffered == -1) {
            // EOF has been reached.
            outgoingDataBuffer->chop(bytesToBuffer);

            _q_bufferOutgoingDataFinished();
            break;
        } else if (bytesBuffered == 0) {
            // nothing read right now, just wait until we get called again
            outgoingDataBuffer->chop(bytesToBuffer);

            break;
        } else {
            // don't break, try to read() again
            outgoingDataBuffer->chop(bytesToBuffer - bytesBuffered);
        }
    }